

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

BoxArray * __thiscall amrex::BoxArray::growcoarsen(BoxArray *this,IntVect *ngrow,IntVect *iv)

{
  int iVar1;
  element_type *peVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Box *pBVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int local_34 [3];
  
  uniqify(this);
  peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar11 = (int)((long)*(pointer *)
                        ((long)&(peVar2->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data + 8) -
                 *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data >> 2) * -0x49249249;
  if (0 < (int)uVar11) {
    uVar12 = 0;
    do {
      pBVar6 = Box::grow((Box *)(uVar12 * 0x1c +
                                *(long *)&(((this->m_ref).
                                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->m_abox).
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data),ngrow);
      iVar1 = iv->vect[0];
      if (((iVar1 != 1) || (iv->vect[1] != 1)) || (iv->vect[2] != 1)) {
        uVar3 = (pBVar6->smallend).vect[0];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar3 < 0) {
              uVar3 = uVar3 + 1;
              uVar8 = -uVar3;
              if (0 < (int)uVar3) {
                uVar8 = uVar3;
              }
              uVar8 = uVar8 >> 2;
LAB_00565896:
              uVar3 = ~uVar8;
            }
            else {
              uVar3 = uVar3 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar3 < 0) {
              uVar3 = uVar3 + 1;
              uVar8 = -uVar3;
              if (0 < (int)uVar3) {
                uVar8 = uVar3;
              }
              uVar8 = uVar8 >> 1;
              goto LAB_00565896;
            }
            uVar3 = uVar3 >> 1;
          }
          else if ((int)uVar3 < 0) {
            iVar5 = uVar3 + 1;
            iVar4 = -iVar5;
            if (0 < iVar5) {
              iVar4 = iVar5;
            }
            uVar3 = ~(iVar4 / iVar1);
          }
          else {
            uVar3 = (int)uVar3 / iVar1;
          }
        }
        (pBVar6->smallend).vect[0] = uVar3;
        uVar3 = (pBVar6->smallend).vect[1];
        iVar1 = iv->vect[1];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar3 < 0) {
              uVar3 = uVar3 + 1;
              uVar8 = -uVar3;
              if (0 < (int)uVar3) {
                uVar8 = uVar3;
              }
              uVar8 = uVar8 >> 2;
LAB_005658f6:
              uVar3 = ~uVar8;
            }
            else {
              uVar3 = uVar3 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar3 < 0) {
              uVar3 = uVar3 + 1;
              uVar8 = -uVar3;
              if (0 < (int)uVar3) {
                uVar8 = uVar3;
              }
              uVar8 = uVar8 >> 1;
              goto LAB_005658f6;
            }
            uVar3 = uVar3 >> 1;
          }
          else if ((int)uVar3 < 0) {
            iVar5 = uVar3 + 1;
            iVar4 = -iVar5;
            if (0 < iVar5) {
              iVar4 = iVar5;
            }
            uVar3 = ~(iVar4 / iVar1);
          }
          else {
            uVar3 = (int)uVar3 / iVar1;
          }
        }
        (pBVar6->smallend).vect[1] = uVar3;
        uVar3 = (pBVar6->smallend).vect[2];
        iVar1 = iv->vect[2];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)uVar3 < 0) {
              uVar3 = uVar3 + 1;
              uVar8 = -uVar3;
              if (0 < (int)uVar3) {
                uVar8 = uVar3;
              }
              uVar8 = uVar8 >> 2;
LAB_00565957:
              uVar3 = ~uVar8;
            }
            else {
              uVar3 = uVar3 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)uVar3 < 0) {
              uVar3 = uVar3 + 1;
              uVar8 = -uVar3;
              if (0 < (int)uVar3) {
                uVar8 = uVar3;
              }
              uVar8 = uVar8 >> 1;
              goto LAB_00565957;
            }
            uVar3 = uVar3 >> 1;
          }
          else if ((int)uVar3 < 0) {
            iVar5 = uVar3 + 1;
            iVar4 = -iVar5;
            if (0 < iVar5) {
              iVar4 = iVar5;
            }
            uVar3 = ~(iVar4 / iVar1);
          }
          else {
            uVar3 = (int)uVar3 / iVar1;
          }
        }
        (pBVar6->smallend).vect[2] = uVar3;
        uVar3 = (pBVar6->btype).itype;
        if (uVar3 == 0) {
          uVar3 = (pBVar6->bigend).vect[0];
          iVar1 = iv->vect[0];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)uVar3 < 0) {
                uVar3 = uVar3 + 1;
                uVar8 = -uVar3;
                if (0 < (int)uVar3) {
                  uVar8 = uVar3;
                }
                uVar8 = uVar8 >> 2;
LAB_00565b6b:
                uVar3 = ~uVar8;
              }
              else {
                uVar3 = uVar3 >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)uVar3 < 0) {
                uVar3 = uVar3 + 1;
                uVar8 = -uVar3;
                if (0 < (int)uVar3) {
                  uVar8 = uVar3;
                }
                uVar8 = uVar8 >> 1;
                goto LAB_00565b6b;
              }
              uVar3 = uVar3 >> 1;
            }
            else if ((int)uVar3 < 0) {
              iVar5 = uVar3 + 1;
              iVar4 = -iVar5;
              if (0 < iVar5) {
                iVar4 = iVar5;
              }
              uVar3 = ~(iVar4 / iVar1);
            }
            else {
              uVar3 = (int)uVar3 / iVar1;
            }
          }
          (pBVar6->bigend).vect[0] = uVar3;
          uVar3 = (pBVar6->bigend).vect[1];
          iVar1 = iv->vect[1];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)uVar3 < 0) {
                uVar3 = uVar3 + 1;
                uVar8 = -uVar3;
                if (0 < (int)uVar3) {
                  uVar8 = uVar3;
                }
                uVar8 = uVar8 >> 2;
LAB_00565bcc:
                uVar3 = ~uVar8;
              }
              else {
                uVar3 = uVar3 >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)uVar3 < 0) {
                uVar3 = uVar3 + 1;
                uVar8 = -uVar3;
                if (0 < (int)uVar3) {
                  uVar8 = uVar3;
                }
                uVar8 = uVar8 >> 1;
                goto LAB_00565bcc;
              }
              uVar3 = uVar3 >> 1;
            }
            else if ((int)uVar3 < 0) {
              iVar5 = uVar3 + 1;
              iVar4 = -iVar5;
              if (0 < iVar5) {
                iVar4 = iVar5;
              }
              uVar3 = ~(iVar4 / iVar1);
            }
            else {
              uVar3 = (int)uVar3 / iVar1;
            }
          }
          (pBVar6->bigend).vect[1] = uVar3;
          uVar3 = (pBVar6->bigend).vect[2];
          iVar1 = iv->vect[2];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)uVar3 < 0) {
                uVar3 = uVar3 + 1;
                uVar8 = -uVar3;
                if (0 < (int)uVar3) {
                  uVar8 = uVar3;
                }
                uVar8 = uVar8 >> 2;
LAB_00565c3a:
                uVar3 = ~uVar8;
              }
              else {
                uVar3 = uVar3 >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)uVar3 < 0) {
                uVar3 = uVar3 + 1;
                uVar8 = -uVar3;
                if (0 < (int)uVar3) {
                  uVar8 = uVar3;
                }
                uVar8 = uVar8 >> 1;
                goto LAB_00565c3a;
              }
              uVar3 = uVar3 >> 1;
            }
            else if ((int)uVar3 < 0) {
              iVar5 = uVar3 + 1;
              iVar4 = -iVar5;
              if (0 < iVar5) {
                iVar4 = iVar5;
              }
              uVar3 = ~(iVar4 / iVar1);
            }
            else {
              uVar3 = (int)uVar3 / iVar1;
            }
          }
        }
        else {
          local_34[0] = 0;
          local_34[1] = 0;
          local_34[2] = 0;
          lVar10 = 0;
          do {
            if (((uVar3 >> ((uint)lVar10 & 0x1f) & 1) != 0) &&
               ((pBVar6->bigend).vect[lVar10] % iv->vect[lVar10] != 0)) {
              local_34[lVar10] = 1;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          uVar8 = (pBVar6->bigend).vect[0];
          iVar1 = iv->vect[0];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)uVar8 < 0) {
                uVar8 = uVar8 + 1;
                uVar3 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar3 = uVar8;
                }
                uVar3 = uVar3 >> 2;
LAB_00565a43:
                uVar8 = ~uVar3;
              }
              else {
                uVar8 = uVar8 >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)uVar8 < 0) {
                uVar8 = uVar8 + 1;
                uVar3 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar3 = uVar8;
                }
                uVar3 = uVar3 >> 1;
                goto LAB_00565a43;
              }
              uVar8 = uVar8 >> 1;
            }
            else if ((int)uVar8 < 0) {
              iVar5 = uVar8 + 1;
              iVar4 = -iVar5;
              if (0 < iVar5) {
                iVar4 = iVar5;
              }
              uVar8 = ~(iVar4 / iVar1);
            }
            else {
              uVar8 = (int)uVar8 / iVar1;
            }
          }
          (pBVar6->bigend).vect[0] = uVar8;
          uVar9 = (pBVar6->bigend).vect[1];
          iVar1 = iv->vect[1];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)uVar9 < 0) {
                uVar9 = uVar9 + 1;
                uVar3 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar3 = uVar9;
                }
                uVar3 = uVar3 >> 2;
LAB_00565aab:
                uVar9 = ~uVar3;
              }
              else {
                uVar9 = uVar9 >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)uVar9 < 0) {
                uVar9 = uVar9 + 1;
                uVar3 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar3 = uVar9;
                }
                uVar3 = uVar3 >> 1;
                goto LAB_00565aab;
              }
              uVar9 = uVar9 >> 1;
            }
            else if ((int)uVar9 < 0) {
              iVar5 = uVar9 + 1;
              iVar4 = -iVar5;
              if (0 < iVar5) {
                iVar4 = iVar5;
              }
              uVar9 = ~(iVar4 / iVar1);
            }
            else {
              uVar9 = (int)uVar9 / iVar1;
            }
          }
          (pBVar6->bigend).vect[1] = uVar9;
          uVar3 = (pBVar6->bigend).vect[2];
          iVar1 = iv->vect[2];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)uVar3 < 0) {
                uVar3 = uVar3 + 1;
                uVar7 = -uVar3;
                if (0 < (int)uVar3) {
                  uVar7 = uVar3;
                }
                uVar7 = uVar7 >> 2;
LAB_00565b12:
                uVar3 = ~uVar7;
              }
              else {
                uVar3 = uVar3 >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)uVar3 < 0) {
                uVar3 = uVar3 + 1;
                uVar7 = -uVar3;
                if (0 < (int)uVar3) {
                  uVar7 = uVar3;
                }
                uVar7 = uVar7 >> 1;
                goto LAB_00565b12;
              }
              uVar3 = uVar3 >> 1;
            }
            else if ((int)uVar3 < 0) {
              iVar5 = uVar3 + 1;
              iVar4 = -iVar5;
              if (0 < iVar5) {
                iVar4 = iVar5;
              }
              uVar3 = ~(iVar4 / iVar1);
            }
            else {
              uVar3 = (int)uVar3 / iVar1;
            }
          }
          (pBVar6->bigend).vect[2] = uVar3;
          (pBVar6->bigend).vect[0] = uVar8 + local_34[0];
          (pBVar6->bigend).vect[1] = uVar9 + local_34[1];
          uVar3 = uVar3 + local_34[2];
        }
        (pBVar6->bigend).vect[2] = uVar3;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uVar11 & 0x7fffffff));
  }
  return this;
}

Assistant:

BoxArray&
BoxArray::growcoarsen (IntVect const& ngrow, const IntVect& iv)
{
    uniqify();

    const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++) {
        m_ref->m_abox[i].grow(ngrow).coarsen(iv);
    }
    return *this;
}